

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O0

void __thiscall
RTree::get_Range_Search_JSON
          (RTree *this,vector<Polygon_*,_std::allocator<Polygon_*>_> *data,string *json)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference ppPVar4;
  reference pvVar5;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  int local_44;
  undefined1 local_40 [4];
  int j;
  vector<Point,_std::allocator<Point>_> dat;
  int i;
  string *json_local;
  vector<Polygon_*,_std::allocator<Polygon_*>_> *data_local;
  RTree *this_local;
  
  std::__cxx11::string::operator+=((string *)json,"[");
  dat.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  while( true ) {
    uVar2 = (ulong)dat.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar3 = std::vector<Polygon_*,_std::allocator<Polygon_*>_>::size(data);
    if (sVar3 <= uVar2) break;
    std::__cxx11::string::operator+=((string *)json,"[");
    std::__cxx11::string::operator+=((string *)json,"{");
    std::__cxx11::string::operator+=((string *)json,"\"elements\":[");
    ppPVar4 = std::vector<Polygon_*,_std::allocator<Polygon_*>_>::operator[]
                        (data,(long)dat.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
    Polygon::get_vertices((vector<Point,_std::allocator<Point>_> *)local_40,*ppPVar4);
    local_44 = 0;
    while( true ) {
      uVar2 = (ulong)local_44;
      sVar3 = std::vector<Point,_std::allocator<Point>_>::size
                        ((vector<Point,_std::allocator<Point>_> *)local_40);
      if (sVar3 <= uVar2) break;
      std::__cxx11::string::operator+=((string *)json,"[");
      pvVar5 = std::vector<Point,_std::allocator<Point>_>::operator[]
                         ((vector<Point,_std::allocator<Point>_> *)local_40,(long)local_44);
      iVar1 = Point::get_X(pvVar5);
      std::__cxx11::to_string(&local_78,iVar1);
      std::__cxx11::string::operator+=((string *)json,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::operator+=((string *)json,",");
      pvVar5 = std::vector<Point,_std::allocator<Point>_>::operator[]
                         ((vector<Point,_std::allocator<Point>_> *)local_40,(long)local_44);
      iVar1 = Point::get_Y(pvVar5);
      std::__cxx11::to_string(&local_98,iVar1);
      std::__cxx11::string::operator+=((string *)json,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::operator+=((string *)json,"]");
      iVar1 = local_44 + 1;
      sVar3 = std::vector<Point,_std::allocator<Point>_>::size
                        ((vector<Point,_std::allocator<Point>_> *)local_40);
      if ((long)iVar1 != sVar3) {
        std::__cxx11::string::operator+=((string *)json,",");
      }
      local_44 = local_44 + 1;
    }
    std::__cxx11::string::operator+=((string *)json,"],");
    std::__cxx11::to_string(&local_d8,0);
    std::operator+(&local_b8,"\"level\":",&local_d8);
    std::__cxx11::string::operator+=((string *)json,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::operator+=((string *)json,"}");
    std::__cxx11::string::operator+=((string *)json,"]");
    iVar1 = dat.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ + 1;
    sVar3 = std::vector<Polygon_*,_std::allocator<Polygon_*>_>::size(data);
    if ((long)iVar1 != sVar3) {
      std::__cxx11::string::operator+=((string *)json,",\n");
    }
    std::vector<Point,_std::allocator<Point>_>::~vector
              ((vector<Point,_std::allocator<Point>_> *)local_40);
    dat.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         dat.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ + 1;
  }
  std::__cxx11::string::operator+=((string *)json,"]");
  return;
}

Assistant:

void RTree::get_Range_Search_JSON(const std::vector<Polygon *> & data, std::string &json){
    json += "[";
    for(int i=0; i<data.size(); i++){
        json +="[";
        json +="{";
        json +="\"elements\":[";    
        auto dat = data[i]->get_vertices();
        for(int j = 0; j < dat.size(); j++){
            json +="[";  
            
            json += std::to_string(dat[j].get_X());
            json += ",";
            json += std::to_string(dat[j].get_Y()); 
        
            json +="]";
            if((j+1) != dat.size())
                    json +=",";
        }            
    
        json +="],";
        json+="\"level\":"+std::to_string(0);
        json += "}";

        json +="]";
        if((i+1) != data.size())
            json +=",\n";
    }
    json += "]";
}